

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t ZSTD_writeSkippableFrame
                 (void *dst,size_t dstCapacity,void *src,size_t srcSize,uint magicVariant)

{
  size_t sVar1;
  
  sVar1 = 0xffffffffffffffba;
  if (((srcSize + 8 <= dstCapacity) && (sVar1 = 0xffffffffffffffb8, srcSize >> 0x20 == 0)) &&
     (sVar1 = 0xffffffffffffffd6, magicVariant < 0x10)) {
    *(uint *)dst = magicVariant | 0x184d2a50;
    *(int *)((long)dst + 4) = (int)srcSize;
    memcpy((void *)((long)dst + 8),src,srcSize);
    sVar1 = srcSize + 8;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_writeSkippableFrame(void* dst, size_t dstCapacity,
                                const void* src, size_t srcSize, unsigned magicVariant) {
    BYTE* op = (BYTE*)dst;
    RETURN_ERROR_IF(dstCapacity < srcSize + ZSTD_SKIPPABLEHEADERSIZE /* Skippable frame overhead */,
                    dstSize_tooSmall, "Not enough room for skippable frame");
    RETURN_ERROR_IF(srcSize > (unsigned)0xFFFFFFFF, srcSize_wrong, "Src size too large for skippable frame");
    RETURN_ERROR_IF(magicVariant > 15, parameter_outOfBound, "Skippable frame magic number variant not supported");

    MEM_writeLE32(op, (U32)(ZSTD_MAGIC_SKIPPABLE_START + magicVariant));
    MEM_writeLE32(op+4, (U32)srcSize);
    ZSTD_memcpy(op+8, src, srcSize);
    return srcSize + ZSTD_SKIPPABLEHEADERSIZE;
}